

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rans_symbol_encoder.h
# Opt level: O3

bool __thiscall
draco::RAnsSymbolEncoder<15>::Create
          (RAnsSymbolEncoder<15> *this,uint64_t *frequencies,int num_symbols,EncoderBuffer *buffer)

{
  int iVar1;
  pointer prVar2;
  uint64_t uVar3;
  pointer __first;
  pointer __last;
  ProbabilityLess this_00;
  bool bVar4;
  int iVar5;
  int *__buffer;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  size_type __new_size;
  uint32_t uVar11;
  uint32_t uVar12;
  int i;
  int iVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined8 uVar19;
  double dVar23;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  pair<int_*,_long> pVar25;
  vector<int,_std::allocator<int>_> sorted_probabilities;
  allocator_type local_a9;
  undefined1 local_a8 [16];
  vector<int,_std::allocator<int>_> local_90;
  ProbabilityLess local_78;
  uint local_6c;
  uint64_t *local_68;
  ulong local_60;
  undefined1 local_58 [16];
  EncoderBuffer *local_40;
  int *local_38;
  
  if (num_symbols < 1) {
    local_a8 = ZEXT816(0);
    uVar9 = 0;
  }
  else {
    uVar6 = 0;
    lVar8 = 0;
    uVar9 = 0;
    do {
      lVar8 = lVar8 + frequencies[uVar6];
      if (frequencies[uVar6] != 0) {
        uVar9 = uVar6 & 0xffffffff;
      }
      uVar6 = uVar6 + 1;
    } while ((uint)num_symbols != uVar6);
    auVar17._8_4_ = (int)((ulong)lVar8 >> 0x20);
    auVar17._0_8_ = lVar8;
    auVar17._12_4_ = 0x45300000;
    auVar22._0_8_ = auVar17._8_8_ - 1.9342813113834067e+25;
    local_a8._0_8_ = auVar22._0_8_ + ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0);
    local_a8._8_8_ = auVar22._0_8_;
  }
  iVar10 = (int)uVar9;
  uVar14 = iVar10 + 1;
  this->num_symbols_ = uVar14;
  __new_size = (size_type)(int)uVar14;
  local_40 = buffer;
  std::vector<draco::rans_sym,_std::allocator<draco::rans_sym>_>::resize
            (&this->probability_table_,__new_size);
  local_78.probabilities = &this->probability_table_;
  local_6c = uVar14;
  local_60 = uVar9;
  if (iVar10 < 0) {
    local_68 = frequencies;
    std::vector<int,_std::allocator<int>_>::vector(&local_90,__new_size,&local_a9);
    uVar6 = 0;
  }
  else {
    prVar2 = (this->probability_table_).
             super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar16 = (ulong)uVar14;
    uVar7 = 0;
    auVar22._0_8_ = (double)DAT_001a9160;
    dVar23 = DAT_001a9160._8_8_;
    uVar6 = 0;
    do {
      uVar3 = frequencies[uVar7];
      auVar24._8_4_ = (int)(uVar3 >> 0x20);
      auVar24._0_8_ = uVar3;
      auVar24._12_4_ = 0x45300000;
      uVar12 = (uint32_t)
               (long)((((auVar24._8_8_ - dVar23) +
                       ((double)CONCAT44(0x43300000,(int)uVar3) - auVar22._0_8_)) /
                      (double)local_a8._0_8_) * 1048576.0 + 0.5);
      uVar11 = uVar12;
      if (uVar3 != 0) {
        uVar11 = 1;
      }
      if (uVar12 != 0) {
        uVar11 = uVar12;
      }
      prVar2[uVar7].prob = uVar11;
      uVar14 = (int)uVar6 + uVar11;
      uVar6 = (ulong)uVar14;
      uVar7 = uVar7 + 1;
    } while (uVar16 != uVar7);
    if (uVar14 == 0x100000) goto LAB_00197b42;
    std::vector<int,_std::allocator<int>_>::vector(&local_90,__new_size,&local_a9);
    auVar17 = _DAT_001a3ce0;
    this = (RAnsSymbolEncoder<15> *)local_78.probabilities;
    local_68 = frequencies;
    if (-1 < iVar10) {
      lVar8 = uVar16 - 1;
      auVar18._8_4_ = (int)lVar8;
      auVar18._0_8_ = lVar8;
      auVar18._12_4_ = (int)((ulong)lVar8 >> 0x20);
      uVar9 = 0;
      auVar18 = auVar18 ^ _DAT_001a3ce0;
      auVar20 = _DAT_001a5130;
      do {
        auVar24 = auVar20 ^ auVar17;
        if ((bool)(~(auVar24._4_4_ == auVar18._4_4_ && auVar18._0_4_ < auVar24._0_4_ ||
                    auVar18._4_4_ < auVar24._4_4_) & 1)) {
          local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar9] = (int)uVar9;
        }
        if ((auVar24._12_4_ != auVar18._12_4_ || auVar24._8_4_ <= auVar18._8_4_) &&
            auVar24._12_4_ <= auVar18._12_4_) {
          local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar9 + 1] = (int)uVar9 + 1;
        }
        uVar9 = uVar9 + 2;
        lVar8 = auVar20._8_8_;
        auVar20._0_8_ = auVar20._0_8_ + 2;
        auVar20._8_8_ = lVar8 + 2;
      } while ((uVar16 + 1 & 0xfffffffffffffffe) != uVar9);
    }
  }
  __last = local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  __first = local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  if (local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    lVar8 = (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    pVar25 = std::get_temporary_buffer<int>((lVar8 - (lVar8 + 1 >> 0x3f)) + 1 >> 1);
    lVar8 = pVar25.second;
    __buffer = pVar25.first;
    if (__buffer == (int *)0x0) {
      lVar8 = 0;
      std::
      __inplace_stable_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<draco::RAnsSymbolEncoder<15>::ProbabilityLess>>
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__last,
                 (_Iter_comp_iter<draco::RAnsSymbolEncoder<15>::ProbabilityLess>)this);
    }
    else {
      std::
      __stable_sort_adaptive<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int*,long,__gnu_cxx::__ops::_Iter_comp_iter<draco::RAnsSymbolEncoder<15>::ProbabilityLess>>
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__last,__buffer,
                 lVar8,(_Iter_comp_iter<draco::RAnsSymbolEncoder<15>::ProbabilityLess>)this);
    }
    operator_delete(__buffer,lVar8 << 2);
  }
  iVar10 = (int)uVar6;
  if (iVar10 < 0x100000) {
    *(int *)(*(long *)this +
            (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1] * 8) =
         (*(int *)(*(long *)this +
                  (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish[-1] * 8) - iVar10) + 0x100000;
  }
  else {
    iVar10 = iVar10 + -0x100000;
    local_38 = local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    lVar8 = *(long *)this;
    do {
      if (0 < (int)local_60) {
        local_58._0_8_ = 1048576.0 / (double)(int)uVar6;
        iVar15 = 0;
        uVar9 = local_60 & 0xffffffff;
        do {
          iVar13 = (int)uVar9;
          iVar1 = local_38[uVar9];
          uVar14 = *(uint *)(lVar8 + (long)iVar1 * 8);
          if (uVar14 < 2) {
            if (iVar15 == 0) {
              if (local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (int *)0x0) {
                operator_delete(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_end_of_storage -
                                (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_start);
              }
              goto LAB_00197c49;
            }
            break;
          }
          local_a8._0_8_ = uVar6;
          auVar22._0_8_ = floor((double)uVar14 * (double)local_58._0_8_);
          iVar5 = 1;
          if (uVar14 - (int)auVar22._0_8_ != 0) {
            iVar5 = uVar14 - (int)auVar22._0_8_;
          }
          if ((int)uVar14 <= iVar5) {
            iVar5 = uVar14 - 1;
          }
          if (iVar10 <= iVar5) {
            iVar5 = iVar10;
          }
          *(uint *)(lVar8 + (long)iVar1 * 8) = uVar14 - iVar5;
          uVar14 = local_a8._0_4_ - iVar5;
          uVar6 = (ulong)uVar14;
          iVar10 = iVar10 - iVar5;
          if (uVar14 == 0x100000) {
            uVar6 = 0x100000;
            break;
          }
          iVar15 = iVar15 + 1;
          uVar9 = (ulong)(iVar13 - 1);
        } while (1 < iVar13);
      }
    } while (0 < iVar10);
  }
  uVar9 = local_60;
  frequencies = local_68;
  if (local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
    frequencies = local_68;
  }
LAB_00197b42:
  this_00.probabilities = (vector<draco::rans_sym,_std::allocator<draco::rans_sym>_> *)local_78;
  uVar14 = 0;
  if (-1 < (int)uVar9) {
    prVar2 = (((vector<draco::rans_sym,_std::allocator<draco::rans_sym>_> *)
              &(local_78.probabilities)->
               super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>)->
             super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = (ulong)local_6c;
    uVar6 = 0;
    do {
      prVar2[uVar6].cum_prob = uVar14;
      uVar14 = uVar14 + prVar2[uVar6].prob;
      uVar6 = uVar6 + 1;
    } while (uVar7 != uVar6);
    if (uVar14 == 0x100000) {
      uVar19 = 0;
      auVar22._0_8_ = 0.0;
      if (-1 < (int)uVar9) {
        uVar9 = 0;
        auVar22._0_8_ = 0.0;
        do {
          uVar14 = (((vector<draco::rans_sym,_std::allocator<draco::rans_sym>_> *)
                    &(this_00.probabilities)->
                     super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>)->
                   super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar9].prob;
          if (uVar14 != 0) {
            auVar21._0_8_ = (double)CONCAT44(0x43300000,(int)frequencies[uVar9]);
            auVar21._8_4_ = (int)(frequencies[uVar9] >> 0x20);
            auVar21._12_4_ = 0x45300000;
            dVar23 = auVar21._8_8_ - 1.9342813113834067e+25;
            local_58._0_8_ = dVar23 + (auVar21._0_8_ - 4503599627370496.0);
            local_58._8_8_ = dVar23;
            local_a8._0_8_ = auVar22._0_8_;
            local_a8._8_8_ = uVar19;
            auVar22._0_8_ = log2((double)uVar14 * 9.5367431640625e-07);
            auVar22._0_8_ = (double)local_a8._0_8_ + auVar22._0_8_ * (double)local_58._0_8_;
            auVar22._8_8_ = local_a8._8_8_;
            uVar19 = local_a8._8_8_;
            local_a8 = auVar22;
          }
          uVar9 = uVar9 + 1;
        } while (uVar7 != uVar9);
      }
      auVar22._0_8_ = ceil((double)((ulong)auVar22._0_8_ ^ (ulong)DAT_001a9180));
      *(long *)((long)this_00.probabilities + 0x20) =
           (long)(auVar22._0_8_ - 9.223372036854776e+18) & (long)auVar22._0_8_ >> 0x3f |
           (long)auVar22._0_8_;
      bVar4 = EncodeTable((RAnsSymbolEncoder<15> *)this_00.probabilities,local_40);
      uVar14 = (uint)bVar4;
    }
    else {
LAB_00197c49:
      uVar14 = 0;
    }
  }
  return SUB41(uVar14,0);
}

Assistant:

bool RAnsSymbolEncoder<unique_symbols_bit_length_t>::Create(
    const uint64_t *frequencies, int num_symbols, EncoderBuffer *buffer) {
  // Compute the total of the input frequencies.
  uint64_t total_freq = 0;
  int max_valid_symbol = 0;
  for (int i = 0; i < num_symbols; ++i) {
    total_freq += frequencies[i];
    if (frequencies[i] > 0) {
      max_valid_symbol = i;
    }
  }
  num_symbols = max_valid_symbol + 1;
  num_symbols_ = num_symbols;
  probability_table_.resize(num_symbols);
  const double total_freq_d = static_cast<double>(total_freq);
  const double rans_precision_d = static_cast<double>(rans_precision_);
  // Compute probabilities by rescaling the normalized frequencies into interval
  // [1, rans_precision - 1]. The total probability needs to be equal to
  // rans_precision.
  int total_rans_prob = 0;
  for (int i = 0; i < num_symbols; ++i) {
    const uint64_t freq = frequencies[i];

    // Normalized probability.
    const double prob = static_cast<double>(freq) / total_freq_d;

    // RAns probability in range of [1, rans_precision - 1].
    uint32_t rans_prob = static_cast<uint32_t>(prob * rans_precision_d + 0.5f);
    if (rans_prob == 0 && freq > 0) {
      rans_prob = 1;
    }
    probability_table_[i].prob = rans_prob;
    total_rans_prob += rans_prob;
  }
  // Because of rounding errors, the total precision may not be exactly accurate
  // and we may need to adjust the entries a little bit.
  if (total_rans_prob != rans_precision_) {
    std::vector<int> sorted_probabilities(num_symbols);
    for (int i = 0; i < num_symbols; ++i) {
      sorted_probabilities[i] = i;
    }
    std::stable_sort(sorted_probabilities.begin(), sorted_probabilities.end(),
                     ProbabilityLess(&probability_table_));
    if (total_rans_prob < rans_precision_) {
      // This happens rather infrequently, just add the extra needed precision
      // to the most frequent symbol.
      probability_table_[sorted_probabilities.back()].prob +=
          rans_precision_ - total_rans_prob;
    } else {
      // We have over-allocated the precision, which is quite common.
      // Rescale the probabilities of all symbols.
      int32_t error = total_rans_prob - rans_precision_;
      while (error > 0) {
        const double act_total_prob_d = static_cast<double>(total_rans_prob);
        const double act_rel_error_d = rans_precision_d / act_total_prob_d;
        for (int j = num_symbols - 1; j > 0; --j) {
          int symbol_id = sorted_probabilities[j];
          if (probability_table_[symbol_id].prob <= 1) {
            if (j == num_symbols - 1) {
              return false;  // Most frequent symbol would be empty.
            }
            break;
          }
          const int32_t new_prob = static_cast<int32_t>(
              floor(act_rel_error_d *
                    static_cast<double>(probability_table_[symbol_id].prob)));
          int32_t fix = probability_table_[symbol_id].prob - new_prob;
          if (fix == 0u) {
            fix = 1;
          }
          if (fix >= static_cast<int32_t>(probability_table_[symbol_id].prob)) {
            fix = probability_table_[symbol_id].prob - 1;
          }
          if (fix > error) {
            fix = error;
          }
          probability_table_[symbol_id].prob -= fix;
          total_rans_prob -= fix;
          error -= fix;
          if (total_rans_prob == rans_precision_) {
            break;
          }
        }
      }
    }
  }

  // Compute the cumulative probability (cdf).
  uint32_t total_prob = 0;
  for (int i = 0; i < num_symbols; ++i) {
    probability_table_[i].cum_prob = total_prob;
    total_prob += probability_table_[i].prob;
  }
  if (total_prob != rans_precision_) {
    return false;
  }

  // Estimate the number of bits needed to encode the input.
  // From Shannon entropy the total number of bits N is:
  //   N = -sum{i : all_symbols}(F(i) * log2(P(i)))
  // where P(i) is the normalized probability of symbol i and F(i) is the
  // symbol's frequency in the input data.
  double num_bits = 0;
  for (int i = 0; i < num_symbols; ++i) {
    if (probability_table_[i].prob == 0) {
      continue;
    }
    const double norm_prob =
        static_cast<double>(probability_table_[i].prob) / rans_precision_d;
    num_bits += static_cast<double>(frequencies[i]) * log2(norm_prob);
  }
  num_expected_bits_ = static_cast<uint64_t>(ceil(-num_bits));
  if (!EncodeTable(buffer)) {
    return false;
  }
  return true;
}